

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_110;
  uv_pipe_t server;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&server,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&server,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      iVar1 = uv_pipe_bind(&server,"/tmp/uv-test-sock2");
      if (iVar1 == -0x16) {
        uv_close(&server,close_cb);
        uVar2 = uv_default_loop();
        uv_run(uVar2,0);
        if (close_cb_called == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_110 = 0x71;
        }
        else {
          pcVar3 = "close_cb_called == 1";
          uStack_110 = 0x6f;
        }
      }
      else {
        pcVar3 = "r == UV_EINVAL";
        uStack_110 = 0x69;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_110 = 0x67;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_110 = 0x65;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-bind-error.c"
          ,uStack_110,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}